

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O2

App * __thiscall CLI::App::needs(App *this,App *app)

{
  OptionNotFound *pOVar1;
  allocator local_61;
  App *app_local;
  string local_58;
  string local_38;
  
  app_local = app;
  if (app == (App *)0x0) {
    pOVar1 = (OptionNotFound *)__cxa_allocate_exception(0x38);
    ::std::__cxx11::string::string((string *)&local_38,"nullptr passed",&local_61);
    OptionNotFound::OptionNotFound(pOVar1,&local_38);
    __cxa_throw(pOVar1,&OptionNotFound::typeinfo,Error::~Error);
  }
  if (app != this) {
    ::std::
    _Rb_tree<CLI::App*,CLI::App*,std::_Identity<CLI::App*>,std::less<CLI::App*>,std::allocator<CLI::App*>>
    ::_M_insert_unique<CLI::App*const&>
              ((_Rb_tree<CLI::App*,CLI::App*,std::_Identity<CLI::App*>,std::less<CLI::App*>,std::allocator<CLI::App*>>
                *)&this->need_subcommands_,&app_local);
    return this;
  }
  pOVar1 = (OptionNotFound *)__cxa_allocate_exception(0x38);
  ::std::__cxx11::string::string((string *)&local_58,"cannot self reference in needs",&local_61);
  OptionNotFound::OptionNotFound(pOVar1,&local_58);
  __cxa_throw(pOVar1,&OptionNotFound::typeinfo,Error::~Error);
}

Assistant:

App *needs(App *app) {
        if(app == nullptr) {
            throw OptionNotFound("nullptr passed");
        }
        if(app == this) {
            throw OptionNotFound("cannot self reference in needs");
        }
        need_subcommands_.insert(app);
        return this;
    }